

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O0

statement * copy_one_statement(dmr_C *C,statement *stmt)

{
  statement *stmt_00;
  expression *peVar1;
  symbol *psVar2;
  symbol_op *psVar3;
  statement *psVar4;
  symbol *psVar5;
  symbol_list *psVar6;
  expression_list *peVar7;
  statement *switch_stmt;
  expression *expr_2;
  symbol *switch_case;
  symbol *switch_break;
  symbol *sym_1;
  expression *retval;
  statement *falses;
  statement *trues;
  expression *cond;
  statement *newst;
  expression *expr_1;
  expression *expr;
  symbol *newsym;
  ptr_list_iter symiter__;
  statement *newstmt;
  symbol *sym;
  statement *stmt_local;
  dmr_C *C_local;
  
  if (stmt == (statement *)0x0) {
    C_local = (dmr_C *)0x0;
  }
  else {
    sym = (symbol *)stmt;
    switch(stmt->type) {
    case STMT_NONE:
      break;
    case STMT_DECLARATION:
      symiter__._16_8_ = dup_statement(C,stmt);
      (((statement *)symiter__._16_8_)->field_2).field_1.expression = (expression *)0x0;
      ptrlist_forward_iterator
                ((ptr_list_iter *)&newsym,(ptr_list *)(stmt->field_2).field_1.expression);
      newstmt = (statement *)ptrlist_iter_next((ptr_list_iter *)&newsym);
      while (newstmt != (statement *)0x0) {
        psVar5 = copy_symbol(C,stmt->pos,(symbol *)newstmt);
        if (psVar5 != (symbol *)newstmt) {
          peVar1 = copy_expression(C,newstmt[2].field_2.field_1.expression);
          (psVar5->field_14).field_2.initializer = peVar1;
        }
        dmrC_add_symbol(C,(symbol_list **)(symiter__._16_8_ + 0x10),psVar5);
        newstmt = (statement *)ptrlist_iter_next((ptr_list_iter *)&newsym);
      }
      sym = (symbol *)symiter__._16_8_;
      break;
    case STMT_EXPRESSION:
    case STMT_CONTEXT:
      peVar1 = copy_expression(C,(stmt->field_2).field_1.expression);
      if (peVar1 != (stmt->field_2).field_1.expression) {
        sym = (symbol *)dup_statement(C,stmt);
        (((anon_union_64_12_0e8c74c2_for_statement_2 *)&(sym->endpos).field_0x4)->field_1).
        expression = peVar1;
      }
      break;
    case STMT_COMPOUND:
      sym = (symbol *)dmrC_alloc_statement(C,stmt->pos,3);
      dmrC_copy_statement(C,stmt,(statement *)sym);
      break;
    case STMT_IF:
      psVar4 = (stmt->field_2).field_3.if_true;
      stmt_00 = (stmt->field_2).field_3.if_false;
      peVar1 = copy_expression(C,(stmt->field_2).field_1.expression);
      psVar4 = copy_one_statement(C,psVar4);
      psVar5 = (symbol *)copy_one_statement(C,stmt_00);
      if ((((stmt->field_2).field_1.expression != peVar1) ||
          ((statement *)(stmt->field_2).field_1.context != psVar4)) ||
         ((symbol *)(stmt->field_2).field_3.if_false != psVar5)) {
        sym = (symbol *)dup_statement(C,stmt);
        (((anon_union_64_12_0e8c74c2_for_statement_2 *)&(sym->endpos).field_0x4)->field_1).
        expression = peVar1;
        sym->ident = (ident *)psVar4;
        sym->next_id = psVar5;
      }
      break;
    case STMT_RETURN:
      peVar1 = copy_expression(C,(stmt->field_2).field_1.expression);
      psVar5 = copy_symbol(C,stmt->pos,(stmt->field_2).field_2.ret_target);
      sym = (symbol *)dup_statement(C,stmt);
      (((anon_union_64_12_0e8c74c2_for_statement_2 *)&(sym->endpos).field_0x4)->field_1).expression
           = peVar1;
      sym->ident = (ident *)psVar5;
      break;
    case STMT_CASE:
      sym = (symbol *)dup_statement(C,stmt);
      psVar5 = copy_symbol(C,sym->pos,sym->replace);
      sym->replace = psVar5;
      (sym->replace->field_14).field_2.stmt = (statement *)sym;
      peVar1 = copy_expression(C,(((anon_union_64_12_0e8c74c2_for_statement_2 *)
                                  &(sym->endpos).field_0x4)->field_1).expression);
      (((anon_union_64_12_0e8c74c2_for_statement_2 *)&(sym->endpos).field_0x4)->field_1).expression
           = peVar1;
      peVar1 = copy_expression(C,(expression *)sym->ident);
      sym->ident = (ident *)peVar1;
      psVar5 = (symbol *)copy_one_statement(C,(statement *)sym->next_id);
      sym->next_id = psVar5;
      break;
    case STMT_SWITCH:
      psVar5 = copy_symbol(C,stmt->pos,(stmt->field_2).field_4.inline_fn);
      psVar2 = copy_symbol(C,stmt->pos,(stmt->field_2).field_6.case_label);
      peVar1 = copy_expression(C,(stmt->field_2).field_1.expression);
      psVar4 = copy_one_statement(C,(stmt->field_2).field_3.if_true);
      sym = (symbol *)dup_statement(C,stmt);
      psVar6 = copy_symbol_list(C,(psVar2->field_14).field_2.symbol_list);
      (psVar2->field_14).field_2.symbol_list = psVar6;
      sym->next_id = psVar5;
      sym->replace = psVar2;
      (((anon_union_64_12_0e8c74c2_for_statement_2 *)&(sym->endpos).field_0x4)->field_1).expression
           = peVar1;
      sym->ident = (ident *)psVar4;
      break;
    case STMT_ITERATOR:
      sym = (symbol *)dup_statement(C,stmt);
      psVar5 = copy_symbol(C,sym->pos,
                           (((anon_union_64_12_0e8c74c2_for_statement_2 *)&(sym->endpos).field_0x4)
                           ->field_5).label_identifier);
      (((anon_union_64_12_0e8c74c2_for_statement_2 *)&(sym->endpos).field_0x4)->field_5).
      label_identifier = psVar5;
      psVar5 = copy_symbol(C,sym->pos,(symbol *)sym->ident);
      sym->ident = (ident *)psVar5;
      psVar6 = copy_symbol_list(C,(symbol_list *)sym->next_id);
      sym->next_id = (symbol *)psVar6;
      psVar5 = (symbol *)copy_one_statement(C,(statement *)sym->replace);
      sym->replace = psVar5;
      peVar1 = copy_expression(C,(expression *)sym->scope);
      sym->scope = (scope *)peVar1;
      psVar5 = (symbol *)copy_one_statement(C,(statement *)(sym->field_12).same_symbol);
      (sym->field_12).same_symbol = psVar5;
      psVar3 = (symbol_op *)copy_one_statement(C,(statement *)sym->op);
      sym->op = psVar3;
      peVar1 = copy_expression(C,(expression *)(sym->field_14).field_0.expansion);
      (sym->field_14).field_0.expansion = (token *)peVar1;
      break;
    case STMT_LABEL:
      sym = (symbol *)dup_statement(C,stmt);
      psVar5 = copy_symbol(C,sym->pos,
                           (((anon_union_64_12_0e8c74c2_for_statement_2 *)&(sym->endpos).field_0x4)
                           ->field_5).label_identifier);
      (((anon_union_64_12_0e8c74c2_for_statement_2 *)&(sym->endpos).field_0x4)->field_5).
      label_identifier = psVar5;
      psVar4 = copy_one_statement(C,(statement *)sym->ident);
      sym->ident = (ident *)psVar4;
      break;
    case STMT_GOTO:
      sym = (symbol *)dup_statement(C,stmt);
      psVar5 = copy_symbol(C,sym->pos,
                           (((anon_union_64_12_0e8c74c2_for_statement_2 *)&(sym->endpos).field_0x4)
                           ->field_5).label_identifier);
      (((anon_union_64_12_0e8c74c2_for_statement_2 *)&(sym->endpos).field_0x4)->field_5).
      label_identifier = psVar5;
      peVar1 = copy_expression(C,(expression *)sym->ident);
      sym->ident = (ident *)peVar1;
      psVar6 = copy_symbol_list(C,(symbol_list *)sym->next_id);
      sym->next_id = (symbol *)psVar6;
      break;
    case STMT_ASM:
      sym = (symbol *)dup_statement(C,stmt);
      peVar7 = copy_asm_constraints(C,(expression_list *)sym->next_id);
      sym->next_id = (symbol *)peVar7;
      peVar7 = copy_asm_constraints(C,(expression_list *)sym->ident);
      sym->ident = (ident *)peVar7;
      break;
    case STMT_RANGE:
      peVar1 = copy_expression(C,(stmt->field_2).field_1.expression);
      if (peVar1 != (stmt->field_2).field_1.expression) {
        sym = (symbol *)dup_statement(C,stmt);
        (((anon_union_64_12_0e8c74c2_for_statement_2 *)&(sym->endpos).field_0x4)->field_1).
        expression = peVar1;
      }
      break;
    default:
      dmrC_warning(C,stmt->pos,"trying to copy statement type %d",(ulong)stmt->type);
    }
    C_local = (dmr_C *)sym;
  }
  return (statement *)C_local;
}

Assistant:

static struct statement *copy_one_statement(struct dmr_C *C, struct statement *stmt)
{
	if (!stmt)
		return NULL;
	switch(stmt->type) {
	case STMT_NONE:
		break;
	case STMT_DECLARATION: {
		struct symbol *sym;
		struct statement *newstmt = dup_statement(C, stmt);
		newstmt->declaration = NULL;
		FOR_EACH_PTR(stmt->declaration, sym) {
			struct symbol *newsym = copy_symbol(C, stmt->pos, sym);
			if (newsym != sym)
				newsym->initializer = copy_expression(C, sym->initializer);
			dmrC_add_symbol(C, &newstmt->declaration, newsym);
		} END_FOR_EACH_PTR(sym);
		stmt = newstmt;
		break;
	}
	case STMT_CONTEXT:
	case STMT_EXPRESSION: {
		struct expression *expr = copy_expression(C, stmt->expression);
		if (expr == stmt->expression)
			break;
		stmt = dup_statement(C, stmt);
		stmt->expression = expr;
		break;
	}
	case STMT_RANGE: {
		struct expression *expr = copy_expression(C, stmt->range_expression);
		if (expr == stmt->expression)
			break;
		stmt = dup_statement(C, stmt);
		stmt->range_expression = expr;
		break;
	}
	case STMT_COMPOUND: {
		struct statement *newst = dmrC_alloc_statement(C, stmt->pos, STMT_COMPOUND);
		dmrC_copy_statement(C, stmt, newst);
		stmt = newst;
		break;
	}
	case STMT_IF: {
		struct expression *cond = stmt->if_conditional;
		struct statement *trues = stmt->if_true;
		struct statement *falses = stmt->if_false;

		cond = copy_expression(C, cond);
		trues = copy_one_statement(C, trues);
		falses = copy_one_statement(C, falses);
		if (stmt->if_conditional == cond &&
		    stmt->if_true == trues &&
		    stmt->if_false == falses)
			break;
		stmt = dup_statement(C, stmt);
		stmt->if_conditional = cond;
		stmt->if_true = trues;
		stmt->if_false = falses;
		break;
	}
	case STMT_RETURN: {
		struct expression *retval = copy_expression(C, stmt->ret_value);
		struct symbol *sym = copy_symbol(C, stmt->pos, stmt->ret_target);

		stmt = dup_statement(C, stmt);
		stmt->ret_value = retval;
		stmt->ret_target = sym;
		break;
	}
	case STMT_CASE: {
		stmt = dup_statement(C, stmt);
		stmt->case_label = copy_symbol(C, stmt->pos, stmt->case_label);
		stmt->case_label->stmt = stmt;
		stmt->case_expression = copy_expression(C, stmt->case_expression);
		stmt->case_to = copy_expression(C, stmt->case_to);
		stmt->case_statement = copy_one_statement(C, stmt->case_statement);
		break;
	}
	case STMT_SWITCH: {
		struct symbol *switch_break = copy_symbol(C, stmt->pos, stmt->switch_break);
		struct symbol *switch_case = copy_symbol(C, stmt->pos, stmt->switch_case);
		struct expression *expr = copy_expression(C, stmt->switch_expression);
		struct statement *switch_stmt = copy_one_statement(C, stmt->switch_statement);

		stmt = dup_statement(C, stmt);
		switch_case->symbol_list = copy_symbol_list(C, switch_case->symbol_list);
		stmt->switch_break = switch_break;
		stmt->switch_case = switch_case;
		stmt->switch_expression = expr;
		stmt->switch_statement = switch_stmt;
		break;		
	}
	case STMT_ITERATOR: {
		stmt = dup_statement(C, stmt);
		stmt->iterator_break = copy_symbol(C, stmt->pos, stmt->iterator_break);
		stmt->iterator_continue = copy_symbol(C, stmt->pos, stmt->iterator_continue);
		stmt->iterator_syms = copy_symbol_list(C, stmt->iterator_syms);

		stmt->iterator_pre_statement = copy_one_statement(C, stmt->iterator_pre_statement);
		stmt->iterator_pre_condition = copy_expression(C, stmt->iterator_pre_condition);

		stmt->iterator_statement = copy_one_statement(C, stmt->iterator_statement);

		stmt->iterator_post_statement = copy_one_statement(C, stmt->iterator_post_statement);
		stmt->iterator_post_condition = copy_expression(C, stmt->iterator_post_condition);
		break;
	}
	case STMT_LABEL: {
		stmt = dup_statement(C, stmt);
		stmt->label_identifier = copy_symbol(C, stmt->pos, stmt->label_identifier);
		stmt->label_statement = copy_one_statement(C, stmt->label_statement);
		break;
	}
	case STMT_GOTO: {
		stmt = dup_statement(C, stmt);
		stmt->goto_label = copy_symbol(C, stmt->pos, stmt->goto_label);
		stmt->goto_expression = copy_expression(C, stmt->goto_expression);
		stmt->target_list = copy_symbol_list(C, stmt->target_list);
		break;
	}
	case STMT_ASM: {
		stmt = dup_statement(C, stmt);
		stmt->asm_inputs = copy_asm_constraints(C, stmt->asm_inputs);
		stmt->asm_outputs = copy_asm_constraints(C, stmt->asm_outputs);
		/* no need to dup "clobbers", since they are all constant strings */
		break;
	}
	default:
		dmrC_warning(C, stmt->pos, "trying to copy statement type %d", stmt->type);
		break;
	}
	return stmt;
}